

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileMonitor.cxx
# Opt level: O3

void __thiscall cmRealDirectoryWatcher::StopWatching(cmRealDirectoryWatcher *this)

{
  int iVar1;
  _Hash_node_base *p_Var2;
  
  if (this->Handle != (uv_fs_event_t *)0x0) {
    uv_fs_event_stop(this->Handle);
    iVar1 = uv_is_closing((uv_handle_t *)this->Handle);
    if (iVar1 == 0) {
      uv_close((uv_handle_t *)this->Handle,anon_unknown.dwarf_11db2a5::on_fs_close);
    }
    this->Handle = (uv_fs_event_t *)0x0;
  }
  for (p_Var2 = (this->super_cmVirtualDirectoryWatcher).Children._M_h._M_before_begin._M_nxt;
      p_Var2 != (_Hash_node_base *)0x0; p_Var2 = p_Var2->_M_nxt) {
    (*(code *)(p_Var2[5]._M_nxt)->_M_nxt[6]._M_nxt)();
  }
  return;
}

Assistant:

void StopWatching() final
  {
    if (this->Handle) {
      uv_fs_event_stop(this->Handle);
      if (!uv_is_closing(reinterpret_cast<uv_handle_t*>(this->Handle))) {
        uv_close(reinterpret_cast<uv_handle_t*>(this->Handle), &on_fs_close);
      }
      this->Handle = nullptr;
    }
    cmVirtualDirectoryWatcher::StopWatching();
  }